

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tourmng.cpp
# Opt level: O3

void banksia::TourMng::append2TextFile(string *path,string *str)

{
  ostream *poVar1;
  ofstream ofs;
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  std::ofstream::ofstream((ostream *)&local_210,(string *)path,_S_out|_S_app);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_210,(str->_M_dataplus)._M_p,str->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::ofstream::close();
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void TourMng::append2TextFile(const std::string& path, const std::string& str)
{
    std::ofstream ofs(path, std::ios_base::out | std::ios_base::app);
    ofs << str << std::endl;
    ofs.close();
}